

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FixedBlockMemoryAllocator.cpp
# Opt level: O0

void __thiscall
Diligent::FixedBlockMemoryAllocator::MemoryPage::dbgVerifyAddress(MemoryPage *this,void *pBlockAddr)

{
  Char *pCVar1;
  undefined1 local_70 [8];
  string msg_1;
  Uint32 BlockIndex;
  undefined1 local_40 [8];
  string msg;
  size_t Delta;
  void *pBlockAddr_local;
  MemoryPage *this_local;
  
  msg.field_2._8_8_ = (long)pBlockAddr - (long)this->m_pPageStart;
  if ((ulong)msg.field_2._8_8_ % this->m_pOwnerAllocator->m_BlockSize != 0) {
    FormatString<char[16]>((string *)local_40,(char (*) [16])"Invalid address");
    pCVar1 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar1,"dbgVerifyAddress",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/src/FixedBlockMemoryAllocator.cpp"
               ,0x5d);
    std::__cxx11::string::~string((string *)local_40);
  }
  msg_1.field_2._8_4_ =
       (undefined4)((ulong)msg.field_2._8_8_ / this->m_pOwnerAllocator->m_BlockSize);
  if (this->m_pOwnerAllocator->m_NumBlocksInPage <= (uint)msg_1.field_2._8_4_) {
    FormatString<char[20]>((string *)local_70,(char (*) [20])"Invalid block index");
    pCVar1 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar1,"dbgVerifyAddress",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/src/FixedBlockMemoryAllocator.cpp"
               ,0x5f);
    std::__cxx11::string::~string((string *)local_70);
  }
  return;
}

Assistant:

void FixedBlockMemoryAllocator::MemoryPage::dbgVerifyAddress(const void* pBlockAddr) const
{
    size_t Delta = reinterpret_cast<const Uint8*>(pBlockAddr) - reinterpret_cast<Uint8*>(m_pPageStart);
    VERIFY(Delta % m_pOwnerAllocator->m_BlockSize == 0, "Invalid address");
    Uint32 BlockIndex = static_cast<Uint32>(Delta / m_pOwnerAllocator->m_BlockSize);
    VERIFY(BlockIndex < m_pOwnerAllocator->m_NumBlocksInPage, "Invalid block index");
}